

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int *piVar10;
  Allocator *pAVar11;
  int k_6;
  int iVar12;
  int iVar13;
  void *pvVar14;
  undefined4 *puVar15;
  uint uVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  undefined4 *puVar23;
  uint uVar24;
  long lVar25;
  uint _w;
  int iVar26;
  long lVar27;
  void *pvVar28;
  long lVar29;
  int k_1;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  void *pvVar36;
  ulong uVar37;
  int k_3;
  int iVar38;
  void *pvVar39;
  long lVar40;
  int iVar41;
  void *pvVar42;
  long lVar43;
  int iVar44;
  void *pvVar45;
  undefined4 *puVar46;
  int k_4;
  long lVar47;
  void *pvVar48;
  undefined4 *puVar49;
  int k;
  int iVar50;
  ulong uVar51;
  long lVar52;
  void *local_138;
  void *local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  int local_fc;
  void *local_c0;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar5 = (this->super_Convolution1D).kernel_w;
  lVar27 = (long)(int)uVar5;
  uVar21 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar5;
  uVar16 = (this->super_Convolution1D).num_output;
  lVar47 = (long)(int)uVar16;
  uVar21 = (long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) /
           (long)(int)uVar16;
  uVar37 = uVar21 & 0xffffffff;
  uVar24 = (uint)uVar21;
  uVar20 = uVar24;
  if (lVar47 < 8) {
    if ((int)uVar16 < 4) {
      if ((int)uVar16 < 2) {
        if ((int)uVar24 < 8) {
          if ((int)uVar24 < 4) {
            _w = uVar5;
            if (1 < (int)uVar24) {
              _w = uVar5 * 2;
              uVar20 = (uVar24 & 1) + 1;
            }
          }
          else {
            _w = uVar5 * 4;
            uVar20 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar5 * 8;
          uVar20 = (uVar24 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                   (uint)((uVar24 >> 1 & 1) != 0);
        }
      }
      else {
        if ((int)uVar24 < 8) {
          if ((int)uVar24 < 4) {
            if ((int)uVar24 < 2) {
              _w = uVar5 * 2;
              uVar16 = (uVar16 & 1) + 1;
              goto LAB_004ccc9c;
            }
            _w = uVar5 * 4;
            uVar20 = (uVar24 & 1) + 1;
          }
          else {
            uVar20 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
            _w = uVar5 * 8;
          }
        }
        else {
          _w = uVar5 << 4;
          uVar20 = (uVar24 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                   (uint)((uVar24 >> 1 & 1) != 0);
        }
        uVar16 = (uVar16 & 1) + 1;
      }
    }
    else {
      if ((int)uVar24 < 8) {
        if ((int)uVar24 < 4) {
          if ((int)uVar24 < 2) {
            _w = uVar5 * 4;
            uVar16 = (uVar16 & 1) + 1 + (uint)((uVar16 >> 1 & 1) != 0);
            goto LAB_004ccc9c;
          }
          _w = uVar5 * 8;
          uVar20 = (uVar24 & 1) + 1;
        }
        else {
          _w = uVar5 << 4;
          uVar20 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
        }
      }
      else {
        _w = uVar5 << 5;
        uVar20 = (uVar24 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
                 (uint)((uVar24 >> 1 & 1) != 0);
      }
      uVar16 = (uVar16 & 1) + 1 + (uint)((uVar16 >> 1 & 1) != 0);
    }
  }
  else {
    if ((int)uVar24 < 8) {
      if ((int)uVar24 < 4) {
        if ((int)uVar24 < 2) {
          _w = uVar5 * 8;
          uVar16 = (uVar16 & 1) + (uVar16 >> 3) + (uVar16 >> 2 & 1) + (uint)((uVar16 >> 1 & 1) != 0)
          ;
          goto LAB_004ccc9c;
        }
        _w = uVar5 << 4;
        uVar20 = (uVar24 & 1) + 1;
      }
      else {
        _w = uVar5 << 5;
        uVar20 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
      }
    }
    else {
      _w = uVar5 << 6;
      uVar20 = (uVar24 & 1) + (int)(uVar37 >> 3) + ((uint)(uVar37 >> 2) & 1) +
               (uint)((uVar24 >> 1 & 1) != 0);
    }
    uVar16 = (uVar16 & 1) + (uVar16 >> 3) + (uVar16 >> 2 & 1) + (uint)((uVar16 >> 1 & 1) != 0);
  }
LAB_004ccc9c:
  Mat::create(&this->weight_data_tm,_w,uVar20,uVar16,4,(Allocator *)0x0);
  pvVar6 = (this->super_Convolution1D).weight_data.data;
  pvVar7 = (this->weight_data_tm).data;
  sVar8 = (this->weight_data_tm).elemsize;
  sVar9 = (this->weight_data_tm).cstep;
  lVar30 = (long)(int)(uVar5 * 4);
  iVar26 = 0;
  uVar21 = 0;
  if (0 < (int)uVar5) {
    uVar21 = (ulong)uVar5;
  }
  lVar33 = (long)(int)(uVar5 * 2);
  iVar41 = uVar5 * uVar24;
  iVar12 = iVar41 * 8;
  iVar38 = iVar41 * 2;
  iVar50 = iVar41 * 3;
  iVar44 = iVar41 * 6;
  lVar17 = (long)(int)(uVar5 * 8) * 4;
  lVar43 = lVar27 * 4;
  iVar13 = iVar41 * 7;
  iVar4 = iVar41 * 5;
  local_fc = iVar41 * 4;
  lVar1 = lVar30 * 4;
  lVar2 = lVar33 * 4;
  lVar3 = uVar21 * 4;
  for (uVar37 = 0; (long)(uVar37 | 7) < lVar47; uVar37 = uVar37 + 8) {
    pvVar14 = (void *)((long)pvVar6 + (long)iVar26 * 4);
    pvVar18 = (void *)((long)pvVar6 + (long)iVar41 * 4);
    pvVar28 = (void *)((long)pvVar6 + (long)iVar38 * 4);
    pvVar34 = (void *)((long)pvVar6 + (long)iVar50 * 4);
    pvVar39 = (void *)((long)pvVar6 + (long)local_fc * 4);
    pvVar42 = (void *)((long)pvVar6 + (long)iVar4 * 4);
    pvVar45 = (void *)((long)pvVar6 + (long)iVar44 * 4);
    pvVar48 = (void *)((long)pvVar6 + (long)iVar13 * 4);
    pvVar36 = (void *)((uVar37 >> 3) * sVar8 * sVar9 + (long)pvVar7);
    lVar52 = 0;
    local_138 = pvVar42;
    local_130 = pvVar39;
    local_128 = pvVar14;
    local_120 = pvVar18;
    local_118 = pvVar28;
    local_110 = pvVar34;
    local_108 = pvVar48;
    local_c0 = pvVar45;
    for (uVar16 = 0; (int)(uVar16 | 7) < (int)uVar24; uVar16 = uVar16 + 8) {
      lVar25 = lVar52;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar31 = lVar25;
        for (lVar22 = 0; (int)lVar22 != 0x100; lVar22 = lVar22 + 0x20) {
          *(undefined4 *)((long)pvVar36 + lVar22) = *(undefined4 *)((long)pvVar14 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 4) = *(undefined4 *)((long)pvVar18 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 8) = *(undefined4 *)((long)pvVar28 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 0xc) = *(undefined4 *)((long)pvVar34 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 0x10) = *(undefined4 *)((long)pvVar39 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 0x14) = *(undefined4 *)((long)pvVar42 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 0x18) = *(undefined4 *)((long)pvVar45 + lVar31);
          *(undefined4 *)((long)pvVar36 + lVar22 + 0x1c) = *(undefined4 *)((long)pvVar48 + lVar31);
          lVar31 = lVar31 + lVar43;
        }
        lVar25 = lVar25 + 4;
        pvVar36 = (void *)((long)pvVar36 + lVar22);
      }
      lVar52 = lVar52 + lVar17;
      local_128 = (void *)((long)local_128 + lVar17);
      local_120 = (void *)((long)local_120 + lVar17);
      local_118 = (void *)((long)local_118 + lVar17);
      local_110 = (void *)((long)local_110 + lVar17);
      local_130 = (void *)((long)local_130 + lVar17);
      local_138 = (void *)((long)local_138 + lVar17);
      local_c0 = (void *)((long)local_c0 + lVar17);
      local_108 = (void *)((long)local_108 + lVar17);
    }
    for (; (int)(uVar16 | 3) < (int)uVar24; uVar16 = uVar16 + 4) {
      pvVar14 = local_108;
      pvVar18 = local_c0;
      pvVar28 = local_138;
      pvVar34 = local_130;
      pvVar39 = local_110;
      pvVar42 = local_120;
      pvVar45 = local_128;
      pvVar48 = local_118;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar52 = 0;
        for (lVar25 = 0; (int)lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
          *(undefined4 *)((long)pvVar36 + lVar25) = *(undefined4 *)((long)pvVar45 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 4) = *(undefined4 *)((long)pvVar42 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 8) = *(undefined4 *)((long)pvVar48 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0xc) = *(undefined4 *)((long)pvVar39 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x10) = *(undefined4 *)((long)pvVar34 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x14) = *(undefined4 *)((long)pvVar28 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x18) = *(undefined4 *)((long)pvVar18 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x1c) = *(undefined4 *)((long)pvVar14 + lVar52);
          lVar52 = lVar52 + lVar43;
        }
        pvVar45 = (void *)((long)pvVar45 + 4);
        pvVar42 = (void *)((long)pvVar42 + 4);
        pvVar48 = (void *)((long)pvVar48 + 4);
        pvVar39 = (void *)((long)pvVar39 + 4);
        pvVar34 = (void *)((long)pvVar34 + 4);
        pvVar28 = (void *)((long)pvVar28 + 4);
        pvVar18 = (void *)((long)pvVar18 + 4);
        pvVar14 = (void *)((long)pvVar14 + 4);
        pvVar36 = (void *)((long)pvVar36 + lVar25);
      }
      local_128 = (void *)((long)local_128 + lVar1);
      local_120 = (void *)((long)local_120 + lVar1);
      local_118 = (void *)((long)local_118 + lVar1);
      local_110 = (void *)((long)local_110 + lVar1);
      local_130 = (void *)((long)local_130 + lVar1);
      local_138 = (void *)((long)local_138 + lVar1);
      local_c0 = (void *)((long)local_c0 + lVar1);
      local_108 = (void *)((long)local_108 + lVar1);
    }
    for (; (int)(uVar16 | 1) < (int)uVar24; uVar16 = uVar16 + 2) {
      pvVar14 = local_108;
      pvVar18 = local_c0;
      pvVar28 = local_138;
      pvVar34 = local_130;
      pvVar39 = local_110;
      pvVar42 = local_120;
      pvVar45 = local_128;
      pvVar48 = local_118;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar52 = 0;
        for (lVar25 = 0; (int)lVar25 != 0x40; lVar25 = lVar25 + 0x20) {
          *(undefined4 *)((long)pvVar36 + lVar25) = *(undefined4 *)((long)pvVar45 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 4) = *(undefined4 *)((long)pvVar42 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 8) = *(undefined4 *)((long)pvVar48 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0xc) = *(undefined4 *)((long)pvVar39 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x10) = *(undefined4 *)((long)pvVar34 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x14) = *(undefined4 *)((long)pvVar28 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x18) = *(undefined4 *)((long)pvVar18 + lVar52);
          *(undefined4 *)((long)pvVar36 + lVar25 + 0x1c) = *(undefined4 *)((long)pvVar14 + lVar52);
          lVar52 = lVar52 + lVar43;
        }
        pvVar45 = (void *)((long)pvVar45 + 4);
        pvVar42 = (void *)((long)pvVar42 + 4);
        pvVar48 = (void *)((long)pvVar48 + 4);
        pvVar39 = (void *)((long)pvVar39 + 4);
        pvVar34 = (void *)((long)pvVar34 + 4);
        pvVar28 = (void *)((long)pvVar28 + 4);
        pvVar18 = (void *)((long)pvVar18 + 4);
        pvVar14 = (void *)((long)pvVar14 + 4);
        pvVar36 = (void *)((long)pvVar36 + lVar25);
      }
      local_128 = (void *)((long)local_128 + lVar2);
      local_120 = (void *)((long)local_120 + lVar2);
      local_118 = (void *)((long)local_118 + lVar2);
      local_110 = (void *)((long)local_110 + lVar2);
      local_130 = (void *)((long)local_130 + lVar2);
      local_138 = (void *)((long)local_138 + lVar2);
      local_c0 = (void *)((long)local_c0 + lVar2);
      local_108 = (void *)((long)local_108 + lVar2);
    }
    for (; (int)uVar16 < (int)uVar24; uVar16 = uVar16 + 1) {
      pvVar14 = pvVar36;
      for (lVar52 = 0; lVar3 != lVar52; lVar52 = lVar52 + 4) {
        *(undefined4 *)((long)pvVar36 + lVar52 * 8) = *(undefined4 *)((long)local_128 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 4) = *(undefined4 *)((long)local_120 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 8) = *(undefined4 *)((long)local_118 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 0xc) =
             *(undefined4 *)((long)local_110 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 0x10) =
             *(undefined4 *)((long)local_130 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 0x14) =
             *(undefined4 *)((long)local_138 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 0x18) =
             *(undefined4 *)((long)local_c0 + lVar52);
        *(undefined4 *)((long)pvVar36 + lVar52 * 8 + 0x1c) =
             *(undefined4 *)((long)local_108 + lVar52);
        pvVar14 = (void *)((long)pvVar14 + 0x20);
      }
      pvVar36 = pvVar14;
    }
    iVar26 = iVar26 + iVar12;
    iVar41 = iVar41 + iVar12;
    iVar38 = iVar38 + iVar12;
    iVar50 = iVar50 + iVar12;
    iVar44 = iVar44 + iVar12;
    iVar13 = iVar13 + iVar12;
    iVar4 = iVar4 + iVar12;
    local_fc = local_fc + iVar12;
  }
  pvVar6 = (this->super_Convolution1D).weight_data.data;
  sVar8 = (this->weight_data_tm).elemsize;
  sVar9 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  iVar13 = uVar5 * uVar24 * 4;
  for (; (long)(uVar37 | 3) < lVar47; uVar37 = uVar37 + 4) {
    pvVar14 = (void *)((long)pvVar6 + (long)iVar26 * 4);
    pvVar18 = (void *)((long)pvVar6 + (long)iVar41 * 4);
    pvVar28 = (void *)((long)pvVar6 + (long)iVar38 * 4);
    pvVar34 = (void *)((long)pvVar6 + (long)iVar50 * 4);
    puVar23 = (undefined4 *)
              ((ulong)(((uint)(uVar37 >> 3) & 0x1fffffff) + (uint)(((uint)uVar37 >> 2 & 1) != 0)) *
               sVar8 * sVar9 + (long)pvVar7);
    lVar52 = 0;
    pvVar39 = pvVar34;
    pvVar42 = pvVar18;
    pvVar45 = pvVar14;
    pvVar48 = pvVar28;
    for (uVar16 = 0; (int)(uVar16 | 7) < (int)uVar24; uVar16 = uVar16 + 8) {
      lVar25 = lVar52;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar31 = lVar25;
        for (lVar22 = 0; (int)lVar22 != 0x80; lVar22 = lVar22 + 0x10) {
          *(undefined4 *)((long)puVar23 + lVar22) = *(undefined4 *)((long)pvVar14 + lVar31);
          *(undefined4 *)((long)puVar23 + lVar22 + 4) = *(undefined4 *)((long)pvVar18 + lVar31);
          *(undefined4 *)((long)puVar23 + lVar22 + 8) = *(undefined4 *)((long)pvVar28 + lVar31);
          *(undefined4 *)((long)puVar23 + lVar22 + 0xc) = *(undefined4 *)((long)pvVar34 + lVar31);
          lVar31 = lVar31 + lVar43;
        }
        puVar23 = (undefined4 *)((long)puVar23 + lVar22);
        lVar25 = lVar25 + 4;
      }
      lVar52 = lVar52 + lVar17;
      pvVar45 = (void *)((long)pvVar45 + lVar17);
      pvVar42 = (void *)((long)pvVar42 + lVar17);
      pvVar48 = (void *)((long)pvVar48 + lVar17);
      pvVar39 = (void *)((long)pvVar39 + lVar17);
    }
    for (; (int)(uVar16 | 3) < (int)uVar24; uVar16 = uVar16 + 4) {
      pvVar14 = pvVar39;
      pvVar18 = pvVar48;
      pvVar28 = pvVar42;
      pvVar34 = pvVar45;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar25 = 0;
        for (lVar52 = 0; (int)lVar52 != 0x40; lVar52 = lVar52 + 0x10) {
          *(undefined4 *)((long)puVar23 + lVar52) = *(undefined4 *)((long)pvVar34 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 4) = *(undefined4 *)((long)pvVar28 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 8) = *(undefined4 *)((long)pvVar18 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 0xc) = *(undefined4 *)((long)pvVar14 + lVar25);
          lVar25 = lVar25 + lVar43;
        }
        puVar23 = (undefined4 *)((long)puVar23 + lVar52);
        pvVar34 = (void *)((long)pvVar34 + 4);
        pvVar28 = (void *)((long)pvVar28 + 4);
        pvVar18 = (void *)((long)pvVar18 + 4);
        pvVar14 = (void *)((long)pvVar14 + 4);
      }
      pvVar45 = (void *)((long)pvVar45 + lVar1);
      pvVar42 = (void *)((long)pvVar42 + lVar1);
      pvVar48 = (void *)((long)pvVar48 + lVar1);
      pvVar39 = (void *)((long)pvVar39 + lVar1);
    }
    for (; (int)(uVar16 | 1) < (int)uVar24; uVar16 = uVar16 + 2) {
      pvVar14 = pvVar39;
      pvVar18 = pvVar48;
      pvVar28 = pvVar42;
      pvVar34 = pvVar45;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar25 = 0;
        for (lVar52 = 0; (int)lVar52 != 0x20; lVar52 = lVar52 + 0x10) {
          *(undefined4 *)((long)puVar23 + lVar52) = *(undefined4 *)((long)pvVar34 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 4) = *(undefined4 *)((long)pvVar28 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 8) = *(undefined4 *)((long)pvVar18 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 0xc) = *(undefined4 *)((long)pvVar14 + lVar25);
          lVar25 = lVar25 + lVar43;
        }
        puVar23 = (undefined4 *)((long)puVar23 + lVar52);
        pvVar34 = (void *)((long)pvVar34 + 4);
        pvVar28 = (void *)((long)pvVar28 + 4);
        pvVar18 = (void *)((long)pvVar18 + 4);
        pvVar14 = (void *)((long)pvVar14 + 4);
      }
      pvVar45 = (void *)((long)pvVar45 + lVar2);
      pvVar42 = (void *)((long)pvVar42 + lVar2);
      pvVar48 = (void *)((long)pvVar48 + lVar2);
      pvVar39 = (void *)((long)pvVar39 + lVar2);
    }
    for (; (int)uVar16 < (int)uVar24; uVar16 = uVar16 + 1) {
      for (uVar51 = 0; uVar21 != uVar51; uVar51 = uVar51 + 1) {
        *puVar23 = *(undefined4 *)((long)pvVar45 + uVar51 * 4);
        puVar23[1] = *(undefined4 *)((long)pvVar42 + uVar51 * 4);
        puVar23[2] = *(undefined4 *)((long)pvVar48 + uVar51 * 4);
        puVar23[3] = *(undefined4 *)((long)pvVar39 + uVar51 * 4);
        puVar23 = puVar23 + 4;
      }
    }
    iVar26 = iVar26 + iVar13;
    iVar41 = iVar41 + iVar13;
    iVar38 = iVar38 + iVar13;
    iVar50 = iVar50 + iVar13;
  }
  pvVar6 = (this->super_Convolution1D).weight_data.data;
  pvVar7 = (this->weight_data_tm).data;
  sVar8 = (this->weight_data_tm).elemsize;
  sVar9 = (this->weight_data_tm).cstep;
  iVar13 = uVar5 * uVar24 * 2;
  for (; (long)(uVar37 | 1) < lVar47; uVar37 = uVar37 + 2) {
    lVar22 = (long)iVar41;
    local_138 = (void *)((long)pvVar6 + lVar22 * 4 + (long)(int)(uVar5 * 7) * 4);
    local_130 = (void *)((long)pvVar6 + lVar22 * 4 + (long)(int)(uVar5 * 6) * 4);
    local_110 = (void *)((long)pvVar6 + lVar22 * 4 + (long)(int)(uVar5 * 5) * 4);
    local_118 = (void *)((long)pvVar6 + lVar22 * 4 + lVar30 * 4);
    lVar52 = (long)pvVar6 + lVar22 * 4 + (long)(int)(uVar5 * 3) * 4;
    lVar25 = (long)pvVar6 + lVar22 * 4 + lVar33 * 4;
    lVar31 = (long)pvVar6 + lVar22 * 4 + lVar27 * 4;
    pvVar14 = (void *)((long)pvVar6 + lVar22 * 4);
    lVar29 = (long)iVar26;
    local_120 = (void *)((long)pvVar6 + lVar29 * 4 + (long)(int)(uVar5 * 7) * 4);
    local_128 = (void *)((long)pvVar6 + lVar29 * 4 + (long)(int)(uVar5 * 6) * 4);
    lVar22 = (long)pvVar6 + lVar29 * 4 + (long)(int)(uVar5 * 5) * 4;
    lVar35 = (long)pvVar6 + lVar29 * 4 + lVar30 * 4;
    lVar32 = (long)pvVar6 + lVar29 * 4 + (long)(int)(uVar5 * 3) * 4;
    lVar40 = (long)pvVar6 + lVar29 * 4 + lVar33 * 4;
    lVar19 = (long)pvVar6 + lVar29 * 4 + lVar27 * 4;
    pvVar18 = (void *)((long)pvVar6 + lVar29 * 4);
    puVar23 = (undefined4 *)
              ((ulong)(((uint)(uVar37 >> 2) & 1) + ((uint)(uVar37 >> 3) & 0x1fffffff) +
                      (uint)(((uint)uVar37 >> 1 & 1) != 0)) * sVar8 * sVar9 + (long)pvVar7);
    for (uVar16 = 0; (int)(uVar16 | 7) < (int)uVar24; uVar16 = uVar16 + 8) {
      for (lVar29 = 0; lVar3 != lVar29; lVar29 = lVar29 + 4) {
        *puVar23 = *(undefined4 *)((long)pvVar18 + lVar29);
        puVar23[1] = *(undefined4 *)(lVar19 + lVar29);
        puVar23[2] = *(undefined4 *)(lVar40 + lVar29);
        puVar23[3] = *(undefined4 *)(lVar32 + lVar29);
        puVar23[4] = *(undefined4 *)(lVar35 + lVar29);
        puVar23[5] = *(undefined4 *)(lVar22 + lVar29);
        puVar23[6] = *(undefined4 *)((long)local_128 + lVar29);
        puVar23[7] = *(undefined4 *)((long)local_120 + lVar29);
        puVar23[8] = *(undefined4 *)((long)pvVar14 + lVar29);
        puVar23[9] = *(undefined4 *)(lVar31 + lVar29);
        puVar23[10] = *(undefined4 *)(lVar25 + lVar29);
        puVar23[0xb] = *(undefined4 *)(lVar52 + lVar29);
        puVar23[0xc] = *(undefined4 *)((long)local_118 + lVar29);
        puVar23[0xd] = *(undefined4 *)((long)local_110 + lVar29);
        puVar23[0xe] = *(undefined4 *)((long)local_130 + lVar29);
        puVar23[0xf] = *(undefined4 *)((long)local_138 + lVar29);
        puVar23 = puVar23 + 0x10;
      }
      pvVar18 = (void *)((long)pvVar18 + lVar17);
      pvVar14 = (void *)((long)pvVar14 + lVar17);
      local_138 = (void *)((long)local_138 + lVar17);
      local_130 = (void *)((long)local_130 + lVar17);
      local_110 = (void *)((long)local_110 + lVar17);
      local_118 = (void *)((long)local_118 + lVar17);
      lVar52 = lVar52 + lVar17;
      lVar25 = lVar25 + lVar17;
      lVar31 = lVar31 + lVar17;
      local_120 = (void *)((long)local_120 + lVar17);
      local_128 = (void *)((long)local_128 + lVar17);
      lVar22 = lVar22 + lVar17;
      lVar35 = lVar35 + lVar17;
      lVar32 = lVar32 + lVar17;
      lVar40 = lVar40 + lVar17;
      lVar19 = lVar19 + lVar17;
    }
    for (; (int)(uVar16 | 3) < (int)uVar24; uVar16 = uVar16 + 4) {
      puVar49 = puVar23;
      for (lVar22 = 0; lVar3 != lVar22; lVar22 = lVar22 + 4) {
        puVar23[lVar22 * 2] = *(undefined4 *)((long)pvVar18 + lVar22);
        puVar23[lVar22 * 2 + 1] = *(undefined4 *)(lVar19 + lVar22);
        puVar23[lVar22 * 2 + 2] = *(undefined4 *)(lVar40 + lVar22);
        puVar23[lVar22 * 2 + 3] = *(undefined4 *)(lVar32 + lVar22);
        puVar23[lVar22 * 2 + 4] = *(undefined4 *)((long)pvVar14 + lVar22);
        puVar23[lVar22 * 2 + 5] = *(undefined4 *)(lVar31 + lVar22);
        puVar23[lVar22 * 2 + 6] = *(undefined4 *)(lVar25 + lVar22);
        puVar23[lVar22 * 2 + 7] = *(undefined4 *)(lVar52 + lVar22);
        puVar49 = puVar49 + 8;
      }
      pvVar18 = (void *)((long)pvVar18 + lVar1);
      pvVar14 = (void *)((long)pvVar14 + lVar1);
      lVar52 = lVar52 + lVar1;
      lVar25 = lVar25 + lVar1;
      lVar31 = lVar31 + lVar1;
      lVar32 = lVar32 + lVar1;
      lVar40 = lVar40 + lVar1;
      lVar19 = lVar19 + lVar1;
      puVar23 = puVar49;
    }
    for (; (int)(uVar16 | 1) < (int)uVar24; uVar16 = uVar16 + 2) {
      pvVar28 = pvVar14;
      pvVar34 = pvVar18;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        lVar25 = 0;
        for (lVar52 = 0; (int)lVar52 != 0x10; lVar52 = lVar52 + 8) {
          *(undefined4 *)((long)puVar23 + lVar52) = *(undefined4 *)((long)pvVar34 + lVar25);
          *(undefined4 *)((long)puVar23 + lVar52 + 4) = *(undefined4 *)((long)pvVar28 + lVar25);
          lVar25 = lVar25 + lVar43;
        }
        puVar23 = (undefined4 *)((long)puVar23 + lVar52);
        pvVar34 = (void *)((long)pvVar34 + 4);
        pvVar28 = (void *)((long)pvVar28 + 4);
      }
      pvVar18 = (void *)((long)pvVar18 + lVar2);
      pvVar14 = (void *)((long)pvVar14 + lVar2);
    }
    for (; (int)uVar16 < (int)uVar24; uVar16 = uVar16 + 1) {
      for (uVar51 = 0; uVar21 != uVar51; uVar51 = uVar51 + 1) {
        *puVar23 = *(undefined4 *)((long)pvVar18 + uVar51 * 4);
        puVar23[1] = *(undefined4 *)((long)pvVar14 + uVar51 * 4);
        puVar23 = puVar23 + 2;
      }
    }
    iVar26 = iVar26 + iVar13;
    iVar41 = iVar41 + iVar13;
  }
  pvVar6 = (this->super_Convolution1D).weight_data.data;
  sVar8 = (this->weight_data_tm).elemsize;
  sVar9 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  for (; (long)uVar37 < lVar47; uVar37 = uVar37 + 1) {
    lVar43 = (long)pvVar6 + (long)iVar26 * 4 + lVar27 * 4;
    puVar23 = (undefined4 *)((long)pvVar6 + (long)iVar26 * 4);
    puVar49 = (undefined4 *)
              ((ulong)(((uint)uVar37 & 1) + ((uint)(uVar37 >> 3) & 0x1fffffff) +
                       ((uint)(uVar37 >> 2) & 1) + (uint)(((uint)uVar37 >> 1 & 1) != 0)) *
               sVar8 * sVar9 + (long)pvVar7);
    for (uVar16 = 0; (int)(uVar16 | 7) < (int)uVar24; uVar16 = uVar16 + 8) {
      puVar15 = puVar23;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        puVar46 = puVar15;
        for (lVar52 = 0; (int)lVar52 != 0x20; lVar52 = lVar52 + 4) {
          *(undefined4 *)((long)puVar49 + lVar52) = *puVar46;
          puVar46 = puVar46 + lVar27;
        }
        puVar49 = (undefined4 *)((long)puVar49 + lVar52);
        puVar15 = puVar15 + 1;
      }
      puVar23 = puVar23 + (int)(uVar5 * 8);
      lVar43 = lVar43 + lVar17;
    }
    for (; (int)(uVar16 | 3) < (int)uVar24; uVar16 = uVar16 + 4) {
      puVar15 = puVar23;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        puVar46 = puVar15;
        for (lVar52 = 0; (int)lVar52 != 0x10; lVar52 = lVar52 + 4) {
          *(undefined4 *)((long)puVar49 + lVar52) = *puVar46;
          puVar46 = puVar46 + lVar27;
        }
        puVar49 = (undefined4 *)((long)puVar49 + lVar52);
        puVar15 = puVar15 + 1;
      }
      puVar23 = puVar23 + lVar30;
      lVar43 = lVar43 + lVar1;
    }
    for (; (int)(uVar16 | 1) < (int)uVar24; uVar16 = uVar16 + 2) {
      for (uVar51 = 0; uVar21 != uVar51; uVar51 = uVar51 + 1) {
        *puVar49 = puVar23[uVar51];
        puVar49[1] = *(undefined4 *)(lVar43 + uVar51 * 4);
        puVar49 = puVar49 + 2;
      }
      puVar23 = puVar23 + lVar33;
      lVar43 = lVar43 + lVar2;
    }
    for (; (int)uVar16 < (int)uVar24; uVar16 = uVar16 + 1) {
      for (lVar43 = 0; lVar3 != lVar43; lVar43 = lVar43 + 4) {
        *(undefined4 *)((long)puVar49 + lVar43) = *(undefined4 *)((long)puVar23 + lVar43);
      }
      puVar49 = (undefined4 *)((long)puVar49 + lVar43);
    }
    iVar26 = iVar26 + uVar5 * uVar24;
  }
  if (opt->lightmode == true) {
    piVar10 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar11 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          free((this->super_Convolution1D).weight_data.data);
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}